

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

blargg_err_t __thiscall Blip_Buffer::sample_rate(Blip_Buffer *this,long new_rate,int msec)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  buf_t_ *pbVar3;
  int in_EDX;
  long in_RSI;
  Blip_Buffer *in_RDI;
  size_t s;
  uint new_size;
  buf_t_ *in_stack_ffffffffffffffc8;
  ulong in_stack_ffffffffffffffd8;
  undefined1 entire_buffer;
  uint uVar4;
  char *local_8;
  
  uVar4 = 0xffffffa8;
  if (in_EDX != 0) {
    in_stack_ffffffffffffffd8 = (in_RSI * (in_EDX + 1) + 999) / 1000;
    if (0xffffffa7 < in_stack_ffffffffffffffd8) {
      __assert_fail("( \"unmet requirement\", false )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.cpp"
                    ,0x36,"blargg_err_t Blip_Buffer::sample_rate(long, int)");
    }
    uVar4 = (uint)in_stack_ffffffffffffffd8;
  }
  entire_buffer = (undefined1)(in_stack_ffffffffffffffd8 >> 0x38);
  if (in_RDI->buffer_size_ != uVar4) {
    in_stack_ffffffffffffffc8 = in_RDI->buffer_;
    if (in_stack_ffffffffffffffc8 != (buf_t_ *)0x0) {
      operator_delete__(in_stack_ffffffffffffffc8);
    }
    in_RDI->buffer_ = (buf_t_ *)0x0;
    in_RDI->buffer_size_ = 0;
    in_RDI->offset_ = 0;
    auVar1 = ZEXT416(uVar4 + 0x18) * ZEXT816(2);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pbVar3 = (buf_t_ *)operator_new__(uVar2,(nothrow_t *)&std::nothrow);
    in_RDI->buffer_ = pbVar3;
    if (in_RDI->buffer_ == (buf_t_ *)0x0) {
      local_8 = "Out of memory";
      return local_8;
    }
  }
  in_RDI->buffer_size_ = uVar4;
  in_RDI->length_ = (int)((long)(ulong)(uVar4 * 1000) / in_RSI) + -1;
  if ((in_EDX != 0) && (in_RDI->length_ != in_EDX)) {
    __assert_fail("length_ == msec",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.cpp"
                  ,0x47,"blargg_err_t Blip_Buffer::sample_rate(long, int)");
  }
  in_RDI->samples_per_sec = in_RSI;
  if (in_RDI->clocks_per_sec != 0) {
    clock_rate(in_RDI,(long)in_stack_ffffffffffffffc8);
  }
  bass_freq(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  clear((Blip_Buffer *)CONCAT44(in_EDX,uVar4),(bool)entire_buffer);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Blip_Buffer::sample_rate( long new_rate, int msec )
{
	unsigned new_size = (unsigned)(ULONG_MAX >> BLIP_BUFFER_ACCURACY) + 1 - widest_impulse_ - 64;
	if ( msec != blip_default_length )
	{
		size_t s = (new_rate * (msec + 1) + 999) / 1000;
		if ( s < new_size )
			new_size = s;
		else
			require( false ); // requested buffer length exceeds limit
	}
	
	if ( buffer_size_ != new_size )
	{
		delete [] buffer_;
		buffer_ = NULL; // allow for exception in allocation below
		buffer_size_ = 0;
		offset_ = 0;
		
		buffer_ = BLARGG_NEW buf_t_ [new_size + widest_impulse_];
		BLARGG_CHECK_ALLOC( buffer_ );
	}
	
	buffer_size_ = new_size;
	length_ = new_size * 1000 / new_rate - 1;
	if ( msec )
		assert( length_ == msec ); // ensure length is same as that passed in
	
	samples_per_sec = new_rate;
	if ( clocks_per_sec )
		clock_rate( clocks_per_sec ); // recalculate factor
	
	bass_freq( bass_freq_ ); // recalculate shift
	
	clear();
	
	return blargg_success;
}